

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

_Bool X86_insn_reg_intel2(uint id,x86_reg *reg1,cs_ac_type *access1,x86_reg *reg2,
                         cs_ac_type *access2)

{
  uint i;
  cs_ac_type *access2_local;
  x86_reg *reg2_local;
  cs_ac_type *access1_local;
  x86_reg *reg1_local;
  uint id_local;
  
  i = 0;
  while( true ) {
    if (7 < i) {
      return false;
    }
    if (insn_regs_intel2[i].insn == id) break;
    i = i + 1;
  }
  *reg1 = insn_regs_intel2[i].reg1;
  *reg2 = insn_regs_intel2[i].reg2;
  if (access1 != (cs_ac_type *)0x0) {
    *access1 = insn_regs_intel2[i].access1;
  }
  if (access2 != (cs_ac_type *)0x0) {
    *access2 = insn_regs_intel2[i].access2;
  }
  return true;
}

Assistant:

bool X86_insn_reg_intel2(unsigned int id, x86_reg *reg1, enum cs_ac_type *access1, x86_reg *reg2, enum cs_ac_type *access2)
{
	unsigned int i;

	for (i = 0; i < ARR_SIZE(insn_regs_intel2); i++) {
		if (insn_regs_intel2[i].insn == id) {
			*reg1 = insn_regs_intel2[i].reg1;
			*reg2 = insn_regs_intel2[i].reg2;
			if (access1)
				*access1 = insn_regs_intel2[i].access1;
			if (access2)
				*access2 = insn_regs_intel2[i].access2;
			return true;
		}
	}

	// not found
	return false;
}